

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 SubsecondPrecision *ssPrec)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  size_t n;
  char *bufLim;
  
  bufLim = buf + bufSz;
  do {
    if (*format != '%') {
      if (*format != '\0') {
LAB_00161eb2:
        if (buf != bufLim) {
          *buf = *format;
          pcVar3 = buf + 1;
          pcVar5 = format;
          goto switchD_00161ef4_caseD_63;
        }
      }
      return buf;
    }
    pcVar5 = format + 1;
    bVar1 = format[1];
    pcVar3 = buf;
    if (bVar1 < 0x61) {
      if (bVar1 < 0x41) {
        if ((bVar1 == 0) || (format = pcVar5, bVar1 == 0x25)) goto LAB_00161eb2;
      }
      else {
        switch(bVar1) {
        case 0x41:
          if (buf < bufLim) {
            pcVar4 = _ZN2el4base6constsL5kDaysE_rel +
                     *(int *)(_ZN2el4base6constsL5kDaysE_rel + (long)tInfo->tm_wday * 4);
            do {
              cVar2 = *pcVar4;
              *buf = cVar2;
              pcVar3 = buf;
              if (cVar2 == '\0') break;
              pcVar4 = pcVar4 + 1;
              buf = buf + 1;
              pcVar3 = bufLim;
            } while (buf != bufLim);
          }
          break;
        case 0x42:
          if (buf < bufLim) {
            pcVar4 = _ZN2el4base6constsL7kMonthsE_rel +
                     *(int *)(_ZN2el4base6constsL7kMonthsE_rel + (long)tInfo->tm_mon * 4);
            do {
              cVar2 = *pcVar4;
              *buf = cVar2;
              pcVar3 = buf;
              if (cVar2 == '\0') break;
              pcVar4 = pcVar4 + 1;
              buf = buf + 1;
              pcVar3 = bufLim;
            } while (buf != bufLim);
          }
          break;
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x47:
          break;
        case 0x46:
          if (buf < bufLim) {
            pcVar4 = "AM";
            if (0xb < tInfo->tm_hour) {
              pcVar4 = "PM";
            }
            do {
              cVar2 = *pcVar4;
              *buf = cVar2;
              pcVar3 = buf;
              if (cVar2 == '\0') break;
              pcVar4 = pcVar4 + 1;
              buf = buf + 1;
              pcVar3 = bufLim;
            } while (buf != bufLim);
          }
          break;
        case 0x48:
          n = (size_t)tInfo->tm_hour;
          goto LAB_001620da;
        default:
          if (bVar1 == 0x4d) {
            n = (long)tInfo->tm_mon + 1;
            goto LAB_001620da;
          }
          if (bVar1 == 0x59) {
            n = (long)tInfo->tm_year + 0x76c;
            iVar6 = 4;
            goto LAB_001620df;
          }
        }
      }
      goto switchD_00161ef4_caseD_63;
    }
    if (0x72 < bVar1) {
      if (bVar1 == 0x73) {
        n = (size_t)tInfo->tm_sec;
      }
      else {
        if (bVar1 != 0x79) {
          if (bVar1 == 0x7a) goto switchD_00161ef4_caseD_67;
          goto switchD_00161ef4_caseD_63;
        }
        n = (long)tInfo->tm_year + 0x76c;
      }
      goto LAB_001620da;
    }
    switch(bVar1) {
    case 0x61:
      if (buf < bufLim) {
        pcVar4 = _ZN2el4base6constsL11kDaysAbbrevE_rel +
                 *(int *)(_ZN2el4base6constsL11kDaysAbbrevE_rel + (long)tInfo->tm_wday * 4);
        do {
          cVar2 = *pcVar4;
          *buf = cVar2;
          pcVar3 = buf;
          if (cVar2 == '\0') break;
          pcVar4 = pcVar4 + 1;
          buf = buf + 1;
          pcVar3 = bufLim;
        } while (buf != bufLim);
      }
      break;
    case 0x62:
      if (buf < bufLim) {
        pcVar4 = _ZN2el4base6constsL13kMonthsAbbrevE_rel +
                 *(int *)(_ZN2el4base6constsL13kMonthsAbbrevE_rel + (long)tInfo->tm_mon * 4);
        do {
          cVar2 = *pcVar4;
          *buf = cVar2;
          pcVar3 = buf;
          if (cVar2 == '\0') break;
          pcVar4 = pcVar4 + 1;
          buf = buf + 1;
          pcVar3 = bufLim;
        } while (buf != bufLim);
      }
      break;
    case 100:
      n = (size_t)tInfo->tm_mday;
      goto LAB_001620da;
    case 0x67:
switchD_00161ef4_caseD_67:
      iVar6 = ssPrec->m_width;
      n = msec;
      goto LAB_001620df;
    case 0x68:
      iVar6 = tInfo->tm_hour;
      n = (size_t)(int)(iVar6 + (((uint)(iVar6 / 6 + (iVar6 >> 0x1f)) >> 1) - (iVar6 >> 0x1f)) *
                                -0xc);
      goto LAB_001620da;
    case 0x6d:
      n = (size_t)tInfo->tm_min;
LAB_001620da:
      iVar6 = 2;
LAB_001620df:
      pcVar3 = Str::convertAndAddToBuff(n,iVar6,buf,bufLim,true);
    }
switchD_00161ef4_caseD_63:
    format = pcVar5 + 1;
    buf = pcVar3;
  } while( true );
}

Assistant:

char* DateTime::parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
                            std::size_t msec, const base::SubsecondPrecision* ssPrec) {
  const char* bufLim = buf + bufSz;
  for (; *format; ++format) {
    if (*format == base::consts::kFormatSpecifierChar) {
      switch (*++format) {
      case base::consts::kFormatSpecifierChar:  // Escape
        break;
      case '\0':  // End
        --format;
        break;
      case 'd':  // Day
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
        continue;
      case 'a':  // Day of week (short)
        buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
        continue;
      case 'A':  // Day of week (long)
        buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
        continue;
      case 'M':  // month
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
        continue;
      case 'b':  // month (short)
        buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
        continue;
      case 'B':  // month (long)
        buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
        continue;
      case 'y':  // year (two digits)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
        continue;
      case 'Y':  // year (four digits)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
        continue;
      case 'h':  // hour (12-hour)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
        continue;
      case 'H':  // hour (24-hour)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
        continue;
      case 'm':  // minute
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
        continue;
      case 's':  // second
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
        continue;
      case 'z':  // subsecond part
      case 'g':
        buf = base::utils::Str::convertAndAddToBuff(msec, ssPrec->m_width, buf, bufLim);
        continue;
      case 'F':  // AM/PM
        buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
        continue;
      default:
        continue;
      }
    }
    if (buf == bufLim) break;
    *buf++ = *format;
  }
  return buf;
}